

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O0

void __thiscall
yactfr::internal::TraceTypeImpl::TraceTypeImpl
          (TraceTypeImpl *this,uint majorVersion,uint minorVersion,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,TraceEnvironment *env,Up *pktHeaderType,ClockTypeSet *clkTypes,
          DataStreamTypeSet *dsts,Up *attrs,TraceType *traceType)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *uid_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ns_local;
  uint minorVersion_local;
  uint majorVersion_local;
  TraceTypeImpl *this_local;
  
  this->_majorVersion = majorVersion;
  this->_minorVersion = minorVersion;
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_ns,ns);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_name,name);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_uid,uid);
  TraceEnvironment::TraceEnvironment(&this->_env,env);
  std::unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>::
  unique_ptr(&this->_pktHeaderType,pktHeaderType);
  std::
  set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
  ::set(&this->_clkTypes,clkTypes);
  std::
  set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
  ::set(&this->_dsts,dsts);
  std::
  unordered_map<unsigned_long_long,_const_yactfr::DataStreamType_*,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_const_yactfr::DataStreamType_*>_>_>
  ::unordered_map(&this->_idsToDsts);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&this->_attrs,attrs);
  this->_traceType = traceType;
  std::
  unique_ptr<yactfr::internal::PktProc_const,std::default_delete<yactfr::internal::PktProc_const>>::
  unique_ptr<std::default_delete<yactfr::internal::PktProc_const>,void>
            ((unique_ptr<yactfr::internal::PktProc_const,std::default_delete<yactfr::internal::PktProc_const>>
              *)&this->_pktProc);
  _buildDstMap(this);
  _createParentLinks(this,traceType);
  _setDispNames(this);
  _setKeyDts(this);
  return;
}

Assistant:

TraceTypeImpl::TraceTypeImpl(const unsigned int majorVersion, const unsigned int minorVersion,
                             boost::optional<std::string>&& ns,
                             boost::optional<std::string>&& name,
                             boost::optional<std::string>&& uid, TraceEnvironment&& env,
                             StructureType::Up pktHeaderType, ClockTypeSet&& clkTypes,
                             DataStreamTypeSet&& dsts, MapItem::Up attrs,
                             const TraceType& traceType) :
    _majorVersion {majorVersion},
    _minorVersion {minorVersion},
    _ns {std::move(ns)},
    _name {std::move(name)},
    _uid {std::move(uid)},
    _env {std::move(env)},
    _pktHeaderType {std::move(pktHeaderType)},
    _clkTypes {std::move(clkTypes)},
    _dsts {std::move(dsts)},
    _attrs {std::move(attrs)},
    _traceType {&traceType}
{
    this->_buildDstMap();
    this->_createParentLinks(traceType);
    this->_setDispNames();
    this->_setKeyDts();
}